

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O0

Inmate * createInmate(InmateType type)

{
  Inmate *pIVar1;
  Inmate *unit;
  InmateType type_local;
  
  pIVar1 = (Inmate *)malloc(0x1c);
  unit._4_1_ = (char)type;
  pIVar1->type = unit._4_1_;
  pIVar1->position = -1.0;
  if (type == PROTAGONIST) {
    pIVar1->maxHealth = 5;
    pIVar1->currentHealth = 5;
    pIVar1->speed = 2;
    pIVar1->rep = 0;
    pIVar1->panic = 0;
    pIVar1->delUnit = false;
  }
  else if (type == ATTORNEY) {
    pIVar1->maxHealth = 0x1e;
    pIVar1->currentHealth = 0x1e;
    pIVar1->speed = 4;
    pIVar1->rep = 0x1e;
    pIVar1->panic = 2;
    pIVar1->delUnit = false;
  }
  else if (type == BRUISER) {
    pIVar1->maxHealth = 0x10;
    pIVar1->currentHealth = 0x10;
    pIVar1->speed = 4;
    pIVar1->rep = 0xf;
    pIVar1->panic = 6;
    pIVar1->delUnit = false;
  }
  else if (type == CUTIE) {
    pIVar1->maxHealth = 0x14;
    pIVar1->currentHealth = 0x14;
    pIVar1->speed = 4;
    pIVar1->rep = 0x14;
    pIVar1->panic = 1;
    pIVar1->delUnit = false;
  }
  else if (type == DOCTOR) {
    pIVar1->maxHealth = 10;
    pIVar1->currentHealth = 10;
    pIVar1->speed = 4;
    pIVar1->rep = 0x28;
    pIVar1->panic = 2;
    pIVar1->delUnit = false;
  }
  else if (type == FATTY) {
    pIVar1->maxHealth = 0x28;
    pIVar1->currentHealth = 0x28;
    pIVar1->speed = 2;
    pIVar1->rep = 10;
    pIVar1->panic = 4;
    pIVar1->delUnit = false;
  }
  else if (type == HOMEBOY) {
    pIVar1->maxHealth = 10;
    pIVar1->currentHealth = 10;
    pIVar1->speed = 4;
    pIVar1->rep = 5;
    pIVar1->panic = 2;
    pIVar1->delUnit = false;
  }
  else if (type == LUNATIC) {
    pIVar1->maxHealth = 0x10;
    pIVar1->currentHealth = 0x10;
    pIVar1->speed = 6;
    pIVar1->rep = 10;
    pIVar1->panic = 8;
    pIVar1->delUnit = false;
  }
  else if (type == SPEEDY) {
    pIVar1->maxHealth = 10;
    pIVar1->currentHealth = 10;
    pIVar1->speed = 8;
    pIVar1->rep = 0x14;
    pIVar1->panic = 2;
    pIVar1->delUnit = false;
  }
  else {
    quit("Creating unsupported unit type.");
  }
  return pIVar1;
}

Assistant:

struct Inmate *createInmate(enum InmateType type) {

    struct Inmate *unit = malloc(sizeof(struct Inmate));

    unit->type = type;
    unit->position = -1;

    switch (type) {

        case PROTAGONIST:
            unit->currentHealth = unit->maxHealth = 5;
            unit->speed = 2;
            unit->rep = 0;
            unit->panic = 0;
            unit->delUnit = FALSE;
            break;

        case HOMEBOY:
            unit->currentHealth = unit->maxHealth = 10;
            unit->speed = 4;
            unit->rep = 5;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        case BRUISER:
            unit->currentHealth = unit->maxHealth = 16;
            unit->speed = 4;
            unit->rep = 15;
            unit->panic = 6;
            unit->delUnit = FALSE;
            break;

        case LUNATIC:
            unit->currentHealth = unit->maxHealth = 16;
            unit->speed = 6;
            unit->rep = 10;
            unit->panic = 8;
            unit->delUnit = FALSE;
            break;

        case FATTY:
            unit->currentHealth = unit->maxHealth = 40;
            unit->speed = 2;
            unit->rep = 10;
            unit->panic = 4;
            unit->delUnit = FALSE;
            break;

        case SPEEDY:
            unit->currentHealth = unit->maxHealth = 10;
            unit->speed = 8;
            unit->rep = 20;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        case CUTIE:
            unit->currentHealth = unit->maxHealth = 20;
            unit->speed = 4;
            unit->rep = 20;
            unit->panic = 1;
            unit->delUnit = FALSE;
            break;

        case ATTORNEY:
            unit->currentHealth = unit->maxHealth = 30;
            unit->speed = 4;
            unit->rep = 30;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        case DOCTOR:
            unit->currentHealth = unit->maxHealth = 10;
            unit->speed = 4;
            unit->rep = 40;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        default:
            quit("Creating unsupported unit type.");
            break;
    }

    return unit;
}